

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O3

void __thiscall
amrex::FabArray<amrex::Mask>::AllocFabs
          (FabArray<amrex::Mask> *this,FabFactory<amrex::Mask> *factory,Arena *ar,
          Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags)

{
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint K;
  pointer piVar1;
  pointer piVar2;
  iterator __position;
  pointer pbVar3;
  string *psVar4;
  undefined4 uVar5;
  value_type *pvVar6;
  int iVar7;
  undefined4 extraout_var;
  pointer ppMVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_2;
  string *tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  value_type *__x;
  pointer __x_00;
  Long nbytes;
  Mask *local_68;
  undefined1 local_60;
  undefined1 local_5f;
  Arena *local_58;
  Box local_4c;
  
  uVar5 = ParallelDescriptor::m_Team._4_4_;
  piVar1 = (this->super_FabArrayBase).indexArray.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  piVar2 = (this->super_FabArrayBase).indexArray.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  (this->shmem).alloc = 1 < (int)ParallelDescriptor::m_Team._4_4_;
  local_60 = (int)uVar5 < 2;
  local_5f = 1 < (int)uVar5;
  uVar11 = (uint)((ulong)((long)piVar1 - (long)piVar2) >> 2);
  local_58 = ar;
  std::vector<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>::reserve
            (&this->m_fabs_v,(long)(int)uVar11);
  if ((int)uVar11 < 1) {
    nbytes = 0;
  }
  else {
    uVar10 = 0;
    nbytes = 0;
    do {
      K = (this->super_FabArrayBase).indexArray.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [uVar10];
      FabArrayBase::fabbox(&local_4c,&this->super_FabArrayBase,K);
      iVar7 = (*factory->_vptr_FabFactory[2])
                        (factory,&local_4c,(ulong)(uint)(this->super_FabArrayBase).n_comp,&local_60,
                         (ulong)K);
      local_68 = (Mask *)CONCAT44(extraout_var,iVar7);
      __position._M_current =
           (this->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Mask*,std::allocator<amrex::Mask*>>::_M_realloc_insert<amrex::Mask*>
                  ((vector<amrex::Mask*,std::allocator<amrex::Mask*>> *)&this->m_fabs_v,__position,
                   &local_68);
        ppMVar8 = (this->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = local_68;
        ppMVar8 = (this->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->m_fabs_v).super__Vector_base<amrex::Mask_*,_std::allocator<amrex::Mask_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppMVar8;
      }
      lVar9 = (ppMVar8[-1]->super_BaseFab<int>).truesize << 2;
      if ((ppMVar8[-1]->super_BaseFab<int>).ptr_owner == false) {
        lVar9 = 0;
      }
      nbytes = nbytes + lVar9;
      uVar10 = uVar10 + 1;
    } while ((uVar11 & 0x7fffffff) != uVar10);
  }
  this_00 = &this->m_tags;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this_00->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ,(this->m_tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [4])"All");
  pvVar6 = DAT_008173c0;
  for (__x = FabArrayBase::m_region_tag_abi_cxx11_; __x != pvVar6; __x = __x + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this_00->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,__x);
  }
  pbVar3 = (tags->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x_00 = (tags->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; __x_00 != pbVar3; __x_00 = __x_00 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this_00->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,__x_00);
  }
  psVar4 = (this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (tag = (this->m_tags).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; tag != psVar4; tag = tag + 1) {
    FabArrayBase::updateMemUsage(tag,nbytes,ar);
  }
  return;
}

Assistant:

void
FabArray<FAB>::AllocFabs (const FabFactory<FAB>& factory, Arena* ar,
                          const Vector<std::string>& tags)
{
    const int n = indexArray.size();
    const int nworkers = ParallelDescriptor::TeamSize();
    shmem.alloc = (nworkers > 1);

    bool alloc = !shmem.alloc;

    FabInfo fab_info;
    fab_info.SetAlloc(alloc).SetShared(shmem.alloc).SetArena(ar);

    m_fabs_v.reserve(n);

    Long nbytes = 0L;
    for (int i = 0; i < n; ++i)
    {
        int K = indexArray[i];
        const Box& tmpbox = fabbox(K);
        m_fabs_v.push_back(factory.create(tmpbox, n_comp, fab_info, K));
        nbytes += amrex::nBytesOwned(*m_fabs_v.back());
    }

    m_tags.clear();
    m_tags.emplace_back("All");
    for (auto const& t : m_region_tag) {
        m_tags.push_back(t);
    }
    for (auto const& t : tags) {
        m_tags.push_back(t);
    }
    for (auto const& t: m_tags) {
        updateMemUsage(t, nbytes, ar);
    }

#ifdef BL_USE_TEAM
    if (shmem.alloc)
    {
        const int teamlead = ParallelDescriptor::MyTeamLead();

        shmem.n_values = 0;
        shmem.n_points = 0;
        Vector<Long> offset(n,0);
        Vector<Long> nextoffset(nworkers,-1);
        for (int i = 0; i < n; ++i) {
            int K = indexArray[i];
            int owner = distributionMap[K] - teamlead;
            Long s = m_fabs_v[i]->size();
            if (ownership[i]) {
                shmem.n_values += s;
                shmem.n_points += m_fabs_v[i]->numPts();
            }
            if (nextoffset[owner] < 0) {
                offset[i] = 0;
                nextoffset[owner] = s;
            } else {
                offset[i] = nextoffset[owner];
                nextoffset[owner] += s;
            }
        }

        size_t bytes = shmem.n_values*sizeof(value_type);

        value_type *mfp;
        Vector<value_type*> dps;

#if defined (BL_USE_MPI3)

        static MPI_Info info = MPI_INFO_NULL;
        if (info == MPI_INFO_NULL) {
            MPI_Info_create(&info);
            MPI_Info_set(info, "alloc_shared_noncontig", "true");
        }

        const MPI_Comm& team_comm = ParallelDescriptor::MyTeam().get();

        BL_MPI_REQUIRE( MPI_Win_allocate_shared(bytes, sizeof(value_type),
                                                info, team_comm, &mfp, &shmem.win) );

        for (int w = 0; w < nworkers; ++w) {
            MPI_Aint sz;
            int disp;
            value_type *dptr = 0;
            BL_MPI_REQUIRE( MPI_Win_shared_query(shmem.win, w, &sz, &disp, &dptr) );
            // BL_ASSERT(disp == sizeof(value_type));
            dps.push_back(dptr);
        }

#else

        amrex::Abort("BaseFab::define: to allocate shared memory, USE_MPI3 must be true");

#endif

        for (int i = 0; i < n; ++i) {
            int K = indexArray[i];
            int owner = distributionMap[K] - teamlead;
            value_type *p = dps[owner] + offset[i];
            m_fabs_v[i]->setPtr(p, m_fabs_v[i]->size());
        }

        for (Long i = 0; i < shmem.n_values; i++, mfp++) {
            new (mfp) value_type;
        }

        amrex::update_fab_stats(shmem.n_points, shmem.n_values, sizeof(value_type));
    }
#endif
}